

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gus_pat.cpp
# Opt level: O0

int convert_8s(uchar *data,_sample *gus_sample)

{
  uint uVar1;
  short *psVar2;
  int *piVar3;
  char *pcVar4;
  uchar *puVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar6;
  short *write_data;
  uchar *read_end;
  uchar *read_data;
  _sample *gus_sample_local;
  uchar *data_local;
  
  uVar1 = gus_sample->data_length;
  uVar6 = 0;
  psVar2 = (short *)calloc((ulong)(gus_sample->data_length + 2),2);
  gus_sample->data = psVar2;
  if (gus_sample->data == (short *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    _WM_ERROR_NEW("(%s:%i) ERROR: calloc failed (%s)","convert_8s",0x49,pcVar4,in_R8,in_R9,uVar6);
    data_local._4_4_ = -1;
  }
  else {
    psVar2 = gus_sample->data;
    read_end = data;
    do {
      puVar5 = read_end + 1;
      *psVar2 = (ushort)*read_end << 8;
      psVar2 = psVar2 + 1;
      read_end = puVar5;
    } while (puVar5 != data + uVar1);
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

static int convert_8s(unsigned char *data, struct _sample *gus_sample) {
	unsigned char *read_data = data;
	unsigned char *read_end = data + gus_sample->data_length;
	signed short int *write_data = NULL;

	SAMPLE_CONVERT_DEBUG(__FUNCTION__);
	gus_sample->data = (short*)calloc((gus_sample->data_length + 2),
			sizeof(signed short int));
	if (gus_sample->data != NULL) {
		write_data = gus_sample->data;
		do {
			*write_data++ = (*read_data++) << 8;
		} while (read_data != read_end);
		return 0;
	}

	_WM_ERROR_NEW("(%s:%i) ERROR: calloc failed (%s)", __FUNCTION__, __LINE__,
			strerror(errno));
	return -1;
}